

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDAQuadSensSVtolerances(void *ida_mem,sunrealtype reltolQS,N_Vector *abstolQS)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  undefined8 uVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  int error_code;
  char *msgfmt;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar6 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar2 = 0x839;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar6 = -0x28;
    error_code = -0x28;
    iVar2 = 0x841;
  }
  else if (*(int *)((long)ida_mem + 0x6c0) == 0) {
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    iVar6 = -0x32;
    error_code = -0x32;
    iVar2 = 0x849;
  }
  else if (0.0 <= reltolQS) {
    if (abstolQS != (N_Vector *)0x0) {
      uVar7 = (ulong)*(int *)((long)ida_mem + 0xa0);
      __ptr = malloc(uVar7 * 8);
      if (0 < (long)uVar7) {
        lVar8 = 0;
        do {
          dVar9 = (double)N_VMin(abstolQS[lVar8]);
          *(double *)((long)__ptr + lVar8 * 8) = dVar9;
          if (dVar9 < 0.0) {
            IDAProcessError((IDAMem)ida_mem,-0x16,0x864,"IDAQuadSensSVtolerances",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                            ,"abstolQS has negative component(s) (illegal).");
            free(__ptr);
            return -0x16;
          }
          lVar8 = lVar8 + 1;
          uVar7 = (ulong)*(int *)((long)ida_mem + 0xa0);
        } while (lVar8 < (long)uVar7);
      }
      *(undefined4 *)((long)ida_mem + 0x130) = 2;
      *(sunrealtype *)((long)ida_mem + 0x138) = reltolQS;
      if (*(int *)((long)ida_mem + 0x6b8) == 0) {
        uVar3 = N_VCloneVectorArray(uVar7 & 0xffffffff,*abstolQS);
        *(undefined8 *)((long)ida_mem + 0x148) = uVar3;
        uVar7 = (ulong)*(int *)((long)ida_mem + 0xa0);
        pvVar4 = malloc(uVar7 * 4);
        *(void **)((long)ida_mem + 0x150) = pvVar4;
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) + *(long *)((long)ida_mem + 0x668) * uVar7;
        *(long *)((long)ida_mem + 0x680) =
             *(long *)((long)ida_mem + 0x680) + uVar7 * *(long *)((long)ida_mem + 0x670);
        *(undefined4 *)((long)ida_mem + 0x6b8) = 1;
      }
      lVar8 = *(long *)((long)ida_mem + 0x7f8);
      if (0 < (int)uVar7) {
        lVar1 = *(long *)((long)ida_mem + 0x150);
        lVar5 = 0;
        do {
          *(undefined8 *)(lVar8 + lVar5 * 8) = 0x3ff0000000000000;
          *(uint *)(lVar1 + lVar5 * 4) = -(uint)(*(double *)((long)__ptr + lVar5 * 8) == 0.0) & 1;
          lVar5 = lVar5 + 1;
          uVar7 = (ulong)*(int *)((long)ida_mem + 0xa0);
        } while (lVar5 < (long)uVar7);
      }
      free(__ptr);
      iVar2 = N_VScaleVectorArray(uVar7 & 0xffffffff,lVar8,abstolQS,
                                  *(undefined8 *)((long)ida_mem + 0x148));
      if (iVar2 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "abstolQS = NULL illegal parameter.";
    iVar6 = -0x16;
    error_code = -0x16;
    iVar2 = 0x859;
  }
  else {
    msgfmt = "reltolQS < 0 illegal parameter.";
    iVar6 = -0x16;
    error_code = -0x16;
    iVar2 = 0x852;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar2,"IDAQuadSensSVtolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar6;
}

Assistant:

int IDAQuadSensSVtolerances(void* ida_mem, sunrealtype reltolQS,
                            N_Vector* abstolQS)
{
  IDAMem IDA_mem;
  int is, retval;
  sunrealtype* atolmin;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Check if sensitivity analysis is active */
  if (!IDA_mem->ida_sensi)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  /* Was sensitivity for quadrature already initialized? */
  if (!IDA_mem->ida_quadSensMallocDone)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELTOLQS);
    return (IDA_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NULL_ABSTOLQS);
    return (IDA_ILL_INPUT);
  }

  atolmin = (sunrealtype*)malloc(IDA_mem->ida_Ns * sizeof(sunrealtype));
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    atolmin[is] = N_VMin(abstolQS[is]);
    if (atolmin[is] < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_ABSTOLQS);
      free(atolmin);
      return (IDA_ILL_INPUT);
    }
  }

  /* Save data. */
  IDA_mem->ida_itolQS = IDA_SV;
  IDA_mem->ida_rtolQS = reltolQS;

  if (!(IDA_mem->ida_VatolQSMallocDone))
  {
    IDA_mem->ida_VatolQS = N_VCloneVectorArray(IDA_mem->ida_Ns, abstolQS[0]);
    IDA_mem->ida_atolQSmin0 =
      (sunbooleantype*)malloc(IDA_mem->ida_Ns * sizeof(sunbooleantype));
    IDA_mem->ida_lrw += IDA_mem->ida_Ns * IDA_mem->ida_lrw1Q;
    IDA_mem->ida_liw += IDA_mem->ida_Ns * IDA_mem->ida_liw1Q;
    IDA_mem->ida_VatolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    IDA_mem->ida_cvals[is]      = ONE;
    IDA_mem->ida_atolQSmin0[is] = (atolmin[is] == ZERO);
  }
  free(atolmin);

  retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals, abstolQS,
                               IDA_mem->ida_VatolQS);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (IDA_SUCCESS);
}